

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_properties.cpp
# Opt level: O3

bool __thiscall ON_3dmProperties::Read(ON_3dmProperties *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  uint archive_3dm_version;
  uint version_number;
  uint tcode;
  ON__INT64 value;
  uint local_64;
  ON_WindowsBitmap *local_60;
  ON_3dmProperties *local_58;
  ON_wString *local_50;
  ON_3dmNotes *local_48;
  ON_3dmApplication *local_40;
  long local_38;
  
  operator=(this,&Empty);
  local_40 = &this->m_Application;
  local_60 = &this->m_PreviewImage;
  local_48 = &this->m_Notes;
  local_50 = &this->m_3dmArchiveFullPathName;
  local_58 = this;
  do {
    bVar1 = ON_BinaryArchive::BeginRead3dmBigChunk(file,&local_64,&local_38);
    if (!bVar1) {
      return false;
    }
    bVar1 = true;
    switch(local_64) {
    case 0x20008021:
      bVar1 = ON_3dmRevisionHistory::Read(&this->m_RevisionHistory,file);
      break;
    case 0x20008022:
      bVar1 = ON_3dmNotes::Read(local_48,file);
      break;
    case 0x20008023:
      bVar1 = ON_WindowsBitmap::ReadUncompressed(local_60,file);
      break;
    case 0x20008024:
      bVar1 = ON_3dmApplication::Read(local_40,file);
      break;
    case 0x20008025:
      bVar1 = ON_WindowsBitmap::ReadCompressed(local_60,file);
      break;
    case 0x20008026:
      break;
    case 0x20008027:
      bVar1 = ON_BinaryArchive::ReadString(file,local_50);
      break;
    default:
      if (local_64 == 0xa0000026) {
        version_number = (uint)local_38;
        if (0xfffffffe < local_38 - 1U) {
          version_number = 0;
        }
        bVar2 = ON_VersionNumberIsValid(version_number);
        bVar1 = true;
        if (!bVar2) {
          archive_3dm_version = ON_BinaryArchive::Archive3dmVersion(file);
          bVar2 = ON_VersionNumberIsYearMonthDateFormat(archive_3dm_version,version_number);
          if (!bVar2) {
            bVar1 = false;
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_3dm_properties.cpp"
                       ,0x1cb,"",
                       "ON_3dmProperties::Read - TCODE_PROPERTIES_OPENNURBS_VERSION corrupt value");
          }
        }
        ON_SetBinaryArchiveOpenNURBSVersion(file,version_number);
        this = local_58;
      }
    }
    bVar2 = ON_BinaryArchive::EndRead3dmChunk(file);
    if (!bVar2) {
      bVar1 = false;
    }
    if (bVar1 != true) {
      return bVar1;
    }
    if (local_64 == 0xffffffff) {
      return true;
    }
  } while( true );
}

Assistant:

bool ON_3dmProperties::Read(ON_BinaryArchive& file )
{
  *this = ON_3dmProperties::Empty;

  bool rc = true;

  unsigned int tcode;
  ON__INT64 value;

  for(;;) 
  {

    rc = file.BeginRead3dmBigChunk( &tcode, &value );
    if ( !rc )
      break;

    switch(tcode) 
    {

    case TCODE_PROPERTIES_OPENNURBS_VERSION:
      { 
        unsigned int opennurbs_version = 0;
        if ( value > 0 && value <= 0xFFFFFFFFll)
        {
          opennurbs_version = (unsigned int)((ON__UINT64)value);
        }

        if (    !ON_VersionNumberIsValid(opennurbs_version)
             && !ON_VersionNumberIsYearMonthDateFormat(file.Archive3dmVersion(),opennurbs_version)
           )
        {
          ON_ERROR("ON_3dmProperties::Read - TCODE_PROPERTIES_OPENNURBS_VERSION corrupt value");
          rc = false;
        }

        ON_SetBinaryArchiveOpenNURBSVersion(file,opennurbs_version);
      }
      break;

    case TCODE_PROPERTIES_AS_FILE_NAME:
      rc = file.ReadString(m_3dmArchiveFullPathName);
      break;
      
    case TCODE_PROPERTIES_REVISIONHISTORY: // file creation/revision information
      rc = m_RevisionHistory.Read(file);
      break;
      
    case TCODE_PROPERTIES_NOTES: // file notes
      rc = m_Notes.Read(file);
      break;
      
    case TCODE_PROPERTIES_PREVIEWIMAGE: // uncompressed preview image
      rc = m_PreviewImage.ReadUncompressed(file);
      break;
      
    case TCODE_PROPERTIES_COMPRESSED_PREVIEWIMAGE: // compressed preview image
      rc = m_PreviewImage.ReadCompressed(file);
      break;
      
    case TCODE_PROPERTIES_APPLICATION: // application that created 3dm file
      rc = m_Application.Read(file);
      break;
      
    default:
      // information added in future will be skipped by file.EndRead3dmChunk()
      break;
    }

    if ( !file.EndRead3dmChunk() )
      rc = false;

    if (!rc)
      break;

    if ( TCODE_ENDOFTABLE == tcode )
      break;
  }

  return rc;
}